

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestSubmitHandler::SubmitUsingHTTP
          (cmCTestSubmitHandler *this,string *localprefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *remoteprefix,string *url)

{
  pointer pbVar1;
  cmCTest *pcVar2;
  pointer pcVar3;
  cmake *pcVar4;
  __uniq_ptr_data<cmState,_std::default_delete<cmState>,_true,_true> this_00;
  char cVar5;
  size_type sVar6;
  string *psVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  ostream *poVar11;
  Curl_easy *pCVar12;
  long *plVar13;
  long lVar14;
  cmCTestScriptHandler *pcVar15;
  cmValue cVar16;
  unsigned_long uVar17;
  FILE *__stream;
  pointer pcVar18;
  string *psVar19;
  size_type *psVar20;
  undefined8 uVar21;
  char *extraout_RDX;
  byte bVar22;
  size_t sVar23;
  char *pcVar24;
  int iVar25;
  ulong uVar26;
  string *h;
  pointer pbVar27;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view value;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tlsVersionStr;
  string local_file;
  cmCTestSubmitHandlerVectorOfChar chunk;
  string retryCount;
  string upload_as;
  cmCTestCurlOpts curlOpts;
  cmCTestSubmitHandlerVectorOfChar chunkDebug;
  string remote_file;
  long response_code;
  ostringstream cmCTestLog_msg;
  string ofile;
  char error_buffer [1024];
  Curl_easy *in_stack_fffffffffffff7c8;
  undefined1 local_830 [24];
  undefined1 local_818 [8];
  bool local_810;
  byte local_7f2;
  byte local_7f1;
  string local_7f0;
  Curl_easy *local_7d0;
  void *local_7c8;
  void *pvStack_7c0;
  long local_7b8;
  string local_7a8;
  string local_788;
  curl_slist *local_768;
  string local_760;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_740;
  _Storage<int,_true> local_734;
  char local_730;
  byte local_72c;
  char local_72b;
  char local_72a;
  void *local_728;
  void *pvStack_720;
  long local_718;
  string local_710;
  long local_6f0;
  int local_6e8;
  int iStack_6e4;
  undefined1 local_6e0 [8];
  _Optional_payload_base<int> local_6d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d0;
  pointer local_6c0;
  pointer local_6b8;
  pointer local_6b0;
  _Alloc_hider local_6a8;
  size_type local_6a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_698;
  _Alloc_hider local_688;
  ios_base local_670 [264];
  string local_568;
  cmCTestSubmitHandlerVectorOfChar local_548;
  cmCTestSubmitHandlerVectorOfChar local_528;
  string local_510;
  string local_4f0;
  string *local_4d0;
  string *local_4c8;
  string *local_4c0;
  string *local_4b8;
  string *local_4b0;
  double local_4a8;
  double local_4a0;
  string local_498;
  string local_478;
  string local_458;
  char local_438 [1032];
  
  local_740 = files;
  local_4d0 = localprefix;
  local_4c8 = url;
  local_4c0 = remoteprefix;
  local_768 = curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
  pbVar27 = (this->HttpHeaders).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->HttpHeaders).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar27 != pbVar1) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_6e0,"   Add HTTP Header: \"",0x15);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_6e0,(pbVar27->_M_dataplus)._M_p,
                           pbVar27->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0xa9,(char *)local_830._0_8_,(this->super_cmCTestGenericHandler).Quiet);
      if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
        operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
      std::ios_base::~ios_base(local_670);
      local_768 = curl_slist_append(local_768,(pbVar27->_M_dataplus)._M_p);
      pbVar27 = pbVar27 + 1;
    } while (pbVar27 != pbVar1);
  }
  curl_global_init(3);
  cmCTestCurlOpts::cmCTestCurlOpts
            ((cmCTestCurlOpts *)&local_734,(this->super_cmCTestGenericHandler).CTest);
  psVar19 = (local_740->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_4b8 = (local_740->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_7f2 = psVar19 == local_4b8;
  do {
    if ((bool)local_7f2) {
      curl_slist_free_all(local_768);
      curl_global_cleanup();
LAB_002b8a87:
      return (bool)(local_7f2 & 1);
    }
    pCVar12 = curl_easy_init();
    if (pCVar12 != (CURL_conflict *)0x0) {
      local_6e0 = (undefined1  [8])&local_6d0;
      local_6d8._M_payload = (_Storage<int,_true>)0x0;
      local_6d8._M_engaged = false;
      local_6d8._5_3_ = 0;
      local_6d0._M_allocated_capacity = local_6d0._M_allocated_capacity & 0xffffffffffffff00;
      cmCurlSetCAInfo(&local_458,pCVar12,(string *)local_6e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
      }
      if (local_6e0 != (undefined1  [8])&local_6d0) {
        operator_delete((void *)local_6e0,local_6d0._M_allocated_capacity + 1);
      }
      local_7d0 = pCVar12;
      if (local_730 == '\x01') {
        cmCurlPrintTLSVersion_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_830,local_734._M_value);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_6e0,"  Set CURLOPT_SSLVERSION to ",0x1c);
        if (local_810 == true) {
          local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_7f0,local_830._0_8_,
                     (char *)(local_830._8_8_ + local_830._0_8_));
        }
        else {
          local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"unknown value","");
        }
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_6e0,local_7f0._M_dataplus._M_p,
                             local_7f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
          operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xbc,local_7f0._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        pCVar12 = local_7d0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
          operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
        std::ios_base::~ios_base(local_670);
        curl_easy_setopt(pCVar12,CURLOPT_SSLVERSION,(ulong)(uint)local_734._M_value);
        if ((local_810 == true) &&
           (local_810 = false, (undefined1 *)local_830._0_8_ != local_830 + 0x10)) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
      }
      if (local_72b == '\x01') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_6e0,"  Set CURLOPT_SSL_VERIFYPEER to ",0x20);
        pcVar24 = "off";
        if ((ulong)local_72c != 0) {
          pcVar24 = "on";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_6e0,pcVar24,(ulong)local_72c ^ 3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6e0,"\n",1);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xc4,(char *)local_830._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        pCVar12 = local_7d0;
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
        std::ios_base::~ios_base(local_670);
        curl_easy_setopt(pCVar12,CURLOPT_SSL_VERIFYPEER,(ulong)local_72c);
      }
      if (local_72a == '\x01') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_6e0,"  Set CURLOPT_SSL_VERIFYHOST to off\n",0x24);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xcb,(char *)local_830._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        pCVar12 = local_7d0;
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
        std::ios_base::~ios_base(local_670);
        curl_easy_setopt(pCVar12,CURLOPT_SSL_VERIFYHOST,0);
      }
      if (0 < this->HTTPProxyType) {
        curl_easy_setopt(pCVar12,CURLOPT_PROXY,(this->HTTPProxy)._M_dataplus._M_p);
        if (this->HTTPProxyType == 3) {
          uVar21 = 5;
        }
        else {
          if (this->HTTPProxyType != 2) {
            curl_easy_setopt(pCVar12,CURLOPT_PROXYTYPE,0);
            if ((this->HTTPProxyAuth)._M_string_length != 0) {
              curl_easy_setopt(pCVar12,CURLOPT_PROXYUSERPWD,(this->HTTPProxyAuth)._M_dataplus._M_p);
            }
            goto LAB_002b6f56;
          }
          uVar21 = 4;
        }
        curl_easy_setopt(pCVar12,CURLOPT_PROXYTYPE,uVar21);
      }
LAB_002b6f56:
      bVar8 = cmCTest::ShouldUseHTTP10((this->super_cmCTestGenericHandler).CTest);
      if (bVar8) {
        curl_easy_setopt(pCVar12,CURLOPT_HTTP_VERSION,1);
      }
      curl_easy_setopt(pCVar12,CURLOPT_UPLOAD,1);
      curl_easy_setopt(pCVar12,CURLOPT_LOW_SPEED_LIMIT,1);
      uVar9 = GetSubmitInactivityTimeout(this);
      if (uVar9 != 0) {
        curl_easy_setopt(pCVar12,CURLOPT_LOW_SPEED_TIME,(ulong)uVar9);
      }
      curl_easy_setopt(pCVar12,CURLOPT_VERBOSE,1);
      curl_easy_setopt(pCVar12,CURLOPT_HTTPHEADER,local_768);
      local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
      pcVar3 = (psVar19->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7f0,pcVar3,pcVar3 + psVar19->_M_string_length);
      bVar8 = cmsys::SystemTools::FileExists(&local_7f0);
      if (!bVar8) {
        local_6d8 = (_Optional_payload_base<int>)(local_4d0->_M_dataplus)._M_p;
        local_6e0 = (undefined1  [8])local_4d0->_M_string_length;
        local_6d0._M_allocated_capacity = 0;
        local_6d0._8_8_ = &DAT_00000001;
        local_6c0 = (pointer)0x9e80a1;
        local_6b8 = (pointer)0x0;
        local_6a8._M_p = (psVar19->_M_dataplus)._M_p;
        local_6b0 = (pointer)psVar19->_M_string_length;
        local_6a0 = 0;
        views._M_len = 3;
        views._M_array = (iterator)local_6e0;
        cmCatViews((string *)local_830,views);
        std::__cxx11::string::operator=((string *)&local_7f0,(string *)local_830);
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
      }
      cmsys::SystemTools::GetFilenameName((string *)local_6e0,psVar19);
      plVar13 = (long *)std::__cxx11::string::replace
                                  ((ulong)local_6e0,0,(char *)0x0,
                                   (ulong)(local_4c0->_M_dataplus)._M_p);
      local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
      psVar20 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_710.field_2._M_allocated_capacity = *psVar20;
        local_710.field_2._8_8_ = plVar13[3];
      }
      else {
        local_710.field_2._M_allocated_capacity = *psVar20;
        local_710._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_710._M_string_length = plVar13[1];
      *plVar13 = (long)psVar20;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if (local_6e0 != (undefined1  [8])&local_6d0) {
        operator_delete((void *)local_6e0,local_6d0._M_allocated_capacity + 1);
      }
      poVar11 = this->LogFile;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\tUpload file: ",0xe);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,local_7f0._M_dataplus._M_p,local_7f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," to ",4);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,local_710._M_dataplus._M_p,local_710._M_string_length);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      cmSystemTools::EncodeURL(&local_568,&local_710,true);
      psVar7 = local_4c8;
      lVar14 = std::__cxx11::string::find((char)local_4c8,0x3f);
      local_818[0] = '&';
      if (lVar14 == -1) {
        local_818[0] = '?';
      }
      local_6d8 = (_Optional_payload_base<int>)(psVar7->_M_dataplus)._M_p;
      local_6e0 = (undefined1  [8])psVar7->_M_string_length;
      local_6d0._M_allocated_capacity = 0;
      local_830._0_8_ = (pointer)0x0;
      local_830._8_8_ = 1;
      local_830._16_8_ = local_818;
      local_6d0._8_8_ = &DAT_00000001;
      local_6b8 = (pointer)0x0;
      local_6b0 = (pointer)0x9;
      local_6a8._M_p = "FileName=";
      local_6a0 = 0;
      local_698._M_allocated_capacity = local_568._M_string_length;
      local_698._8_8_ = local_568._M_dataplus._M_p;
      local_688._M_p = (pointer)0x0;
      views_00._M_len = 4;
      views_00._M_array = (iterator)local_6e0;
      local_6c0 = (pointer)local_830._16_8_;
      cmCatViews(&local_760,views_00);
      if (!bVar8) {
        cmCTestCurl::cmCTestCurl((cmCTestCurl *)local_6e0,(this->super_cmCTestGenericHandler).CTest)
        ;
        std::__cxx11::string::append((char *)&local_760);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"BuildName","");
        cmCTest::GetCTestConfiguration(&local_788,pcVar2,&local_7a8);
        cmCTestCurl::Escape((string *)local_830,(cmCTestCurl *)local_6e0,&local_788);
        std::__cxx11::string::_M_append((char *)&local_760,local_830._0_8_);
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_760);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"Site","");
        cmCTest::GetCTestConfiguration(&local_788,pcVar2,&local_7a8);
        cmCTestCurl::Escape((string *)local_830,(cmCTestCurl *)local_6e0,&local_788);
        std::__cxx11::string::_M_append((char *)&local_760,local_830._0_8_);
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_760);
        cmCTest::GetCurrentTag_abi_cxx11_(&local_788,(this->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape((string *)local_830,(cmCTestCurl *)local_6e0,&local_788);
        std::__cxx11::string::_M_append((char *)&local_760,local_830._0_8_);
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_760);
        cmCTest::GetTestModelString_abi_cxx11_(&local_788,(this->super_cmCTestGenericHandler).CTest)
        ;
        cmCTestCurl::Escape((string *)local_830,(cmCTestCurl *)local_6e0,&local_788);
        std::__cxx11::string::_M_append((char *)&local_760,local_830._0_8_);
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        pcVar15 = cmCTest::GetScriptHandler((this->super_cmCTestGenericHandler).CTest);
        pcVar4 = (pcVar15->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
                 _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                 super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
        if (pcVar4 != (cmake *)0x0) {
          this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
          super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
               (pcVar4->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
          local_830._0_8_ = local_830 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"SubProject","");
          cVar16 = cmState::GetGlobalProperty
                             ((cmState *)
                              this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                              _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                              super__Head_base<0UL,_cmState_*,_false>._M_head_impl,
                              (string *)local_830);
          if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
            operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
          }
          if (cVar16.Value != (string *)0x0) {
            std::__cxx11::string::append((char *)&local_760);
            cmCTestCurl::Escape((string *)local_830,(cmCTestCurl *)local_6e0,cVar16.Value);
            std::__cxx11::string::_M_append((char *)&local_760,local_830._0_8_);
            if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
              operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
            }
          }
        }
        cmCTestCurl::~cmCTestCurl((cmCTestCurl *)local_6e0);
      }
      iVar10 = std::__cxx11::string::compare((char *)psVar19);
      if (iVar10 == 0) {
        cmCTest::GenerateDoneFile((this->super_cmCTestGenericHandler).CTest);
      }
      std::__cxx11::string::append((char *)&local_760);
      local_6e0 = (undefined1  [8])&local_6d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"InternalTest","");
      cVar16 = cmCTestGenericHandler::GetOption
                         (&this->super_cmCTestGenericHandler,(string *)local_6e0);
      if (cVar16.Value == (string *)0x0) {
        bVar8 = false;
      }
      else {
        value._M_str = extraout_RDX;
        value._M_len = (size_t)((cVar16.Value)->_M_dataplus)._M_p;
        bVar8 = cmValue::IsOn((cmValue *)(cVar16.Value)->_M_string_length,value);
      }
      if (local_6e0 != (undefined1  [8])&local_6d0) {
        operator_delete((void *)local_6e0,local_6d0._M_allocated_capacity + 1);
      }
      if (bVar8 == false) {
        cmCryptoHash::cmCryptoHash((cmCryptoHash *)local_830,AlgoMD5);
        cmCryptoHash::HashFile((string *)local_6e0,(cmCryptoHash *)local_830,&local_7f0);
        std::__cxx11::string::_M_append((char *)&local_760,(ulong)local_6e0);
        if (local_6e0 != (undefined1  [8])&local_6d0) {
          operator_delete((void *)local_6e0,local_6d0._M_allocated_capacity + 1);
        }
        cmCryptoHash::~cmCryptoHash((cmCryptoHash *)local_830);
      }
      else {
        std::__cxx11::string::append((char *)&local_760);
      }
      bVar8 = cmsys::SystemTools::FileExists(&local_7f0);
      if (!bVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_6e0,"   Cannot find file: ",0x15);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_6e0,local_7f0._M_dataplus._M_p,
                             local_7f0._M_string_length);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x135,(char *)local_830._0_8_,false);
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
        std::ios_base::~ios_base(local_670);
        curl_easy_cleanup(in_stack_fffffffffffff7c8);
        curl_slist_free_all(local_768);
        curl_global_cleanup();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_760._M_dataplus._M_p != &local_760.field_2) {
          operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != &local_568.field_2) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_710._M_dataplus._M_p != &local_710.field_2) {
          operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
          operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002b8a87;
      }
      uVar17 = cmsys::SystemTools::FileLength(&local_7f0);
      __stream = (FILE *)cmsys::SystemTools::Fopen(&local_7f0,"rb");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_6e0,"   Upload file: ",0x10);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_6e0,local_7f0._M_dataplus._M_p,
                           local_7f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," to ",4);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,local_760._M_dataplus._M_p,local_760._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," Size: ",7);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x142,(char *)local_830._0_8_,(this->super_cmCTestGenericHandler).Quiet);
      if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
        operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
      std::ios_base::~ios_base(local_670);
      pCVar12 = local_7d0;
      curl_easy_setopt(local_7d0,CURLOPT_URL,local_760._M_dataplus._M_p);
      curl_easy_setopt(pCVar12,CURLOPT_FOLLOWLOCATION,1);
      curl_easy_setopt(pCVar12,CURLOPT_HTTPAUTH,0xffffffffffffffef);
      curl_easy_setopt(pCVar12,CURLOPT_READDATA,__stream);
      curl_easy_setopt(pCVar12,CURLOPT_INFILESIZE,uVar17);
      curl_easy_setopt(pCVar12,CURLOPT_ERRORBUFFER,local_438);
      curl_easy_setopt(pCVar12,CURLOPT_WRITEFUNCTION,cmCTestSubmitHandlerWriteMemoryCallback);
      curl_easy_setopt(pCVar12,CURLOPT_DEBUGFUNCTION,cmCTestSubmitHandlerCurlDebugCallback);
      local_7c8 = (void *)0x0;
      pvStack_7c0 = (void *)0x0;
      local_7b8 = 0;
      local_718 = 0;
      local_728 = (void *)0x0;
      pvStack_720 = (void *)0x0;
      curl_easy_setopt(pCVar12,CURLOPT_WRITEDATA,&local_7c8);
      curl_easy_setopt(pCVar12,CURLOPT_DEBUGDATA,&local_728);
      curl_easy_perform(pCVar12);
      local_4b0 = psVar19;
      if (local_7c8 != pvStack_7c0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_6e0,"CURL output: [",0xe);
        if (pvStack_7c0 != local_7c8) {
          std::ostream::write((char *)local_6e0,(long)local_7c8);
          std::ostream::flush();
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6e0,"]",1);
        cVar5 = (char)(ostringstream *)local_6e0;
        std::ios::widen((char)*(undefined8 *)((long)local_6e0 + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x16b,(char *)local_830._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
        std::ios_base::~ios_base(local_670);
        local_528.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_528.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_528.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        uVar26 = (long)pvStack_7c0 - (long)local_7c8;
        if (uVar26 == 0) {
          pcVar18 = (pointer)0x0;
        }
        else {
          if ((long)uVar26 < 0) {
            std::__throw_bad_alloc();
          }
          pcVar18 = (pointer)operator_new(uVar26);
        }
        local_528.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pcVar18 + uVar26;
        sVar23 = (long)pvStack_7c0 - (long)local_7c8;
        local_528.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = pcVar18;
        if (sVar23 != 0) {
          local_528.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = pcVar18;
          memmove(pcVar18,local_7c8,sVar23);
        }
        local_528.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = pcVar18 + sVar23;
        ParseResponse(this,&local_528);
        if (pcVar18 != (pointer)0x0) {
          operator_delete(pcVar18,uVar26);
        }
      }
      if (local_728 != pvStack_720) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_6e0,"CURL debug output: [",0x14);
        if (pvStack_720 != local_728) {
          std::ostream::write((char *)local_6e0,(long)local_728);
          std::ostream::flush();
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6e0,"]",1);
        cVar5 = (char)(ostringstream *)local_6e0;
        std::ios::widen((char)*(undefined8 *)((long)local_6e0 + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x174,(char *)local_830._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
        std::ios_base::~ios_base(local_670);
      }
      curl_easy_getinfo(local_7d0,CURLINFO_RESPONSE_CODE,&local_6f0);
      if ((local_6f0 != 200) || (bVar22 = 1, this->HasErrors == true)) {
        local_6e0 = (undefined1  [8])&local_6d0;
        local_7f1 = local_6f0 == 200;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"RetryDelay","");
        psVar19 = (string *)
                  cmCTestGenericHandler::GetOption
                            (&this->super_cmCTestGenericHandler,(string *)local_6e0);
        if (psVar19 == (string *)0x0) {
          psVar19 = &cmValue::Empty_abi_cxx11_;
        }
        local_830._0_8_ = local_830 + 0x10;
        pcVar3 = (psVar19->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_830,pcVar3,pcVar3 + psVar19->_M_string_length);
        if (local_6e0 != (undefined1  [8])&local_6d0) {
          operator_delete((void *)local_6e0,local_6d0._M_allocated_capacity + 1);
        }
        local_6e0 = (undefined1  [8])&local_6d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"RetryCount","");
        psVar19 = (string *)
                  cmCTestGenericHandler::GetOption
                            (&this->super_cmCTestGenericHandler,(string *)local_6e0);
        if (psVar19 == (string *)0x0) {
          psVar19 = &cmValue::Empty_abi_cxx11_;
        }
        local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
        pcVar3 = (psVar19->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_788,pcVar3,pcVar3 + psVar19->_M_string_length);
        if (local_6e0 != (undefined1  [8])&local_6d0) {
          operator_delete((void *)local_6e0,local_6d0._M_allocated_capacity + 1);
        }
        uVar21 = local_830._8_8_;
        psVar19 = (string *)local_830;
        if (local_830._8_8_ == 0) {
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4f0,"CTestSubmitRetryDelay","");
          psVar19 = &local_478;
          cmCTest::GetCTestConfiguration(psVar19,pcVar2,&local_4f0);
        }
        iVar10 = atoi((psVar19->_M_dataplus)._M_p);
        local_740 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(local_740._4_4_,iVar10);
        if (uVar21 == 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
            operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
          }
        }
        sVar6 = local_788._M_string_length;
        psVar19 = &local_788;
        if (local_788._M_string_length == 0) {
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_510,"CTestSubmitRetryCount","");
          psVar19 = &local_498;
          cmCTest::GetCTestConfiguration(psVar19,pcVar2,&local_510);
        }
        iVar10 = atoi((psVar19->_M_dataplus)._M_p);
        if (sVar6 == 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_510._M_dataplus._M_p != &local_510.field_2) {
            operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
          }
        }
        local_4a0 = (double)(int)local_740;
        local_4a8 = local_4a0 * 1000000000.0;
        iVar25 = 0;
        local_6e8 = iVar10;
        iStack_6e4 = iVar10;
        if (iVar10 < 1) {
          iStack_6e4 = 0;
        }
        do {
          if (iVar25 == iStack_6e4) break;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_6e0,"   Submit failed, waiting ",0x1a);
          poVar11 = std::ostream::_M_insert<double>(local_4a0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," seconds...\n",0xc);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,399,local_7a8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
            operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
          std::ios_base::~ios_base(local_670);
          lVar14 = std::chrono::_V2::steady_clock::now();
          local_740 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((double)lVar14 + local_4a8);
          while (lVar14 = std::chrono::_V2::steady_clock::now(), (double)lVar14 < (double)local_740)
          {
            cmsys::SystemTools::Delay(100);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_6e0,"   Retry submission: Attempt ",0x1d);
          iVar25 = iVar25 + 1;
          poVar11 = (ostream *)std::ostream::operator<<((ostringstream *)local_6e0,iVar25);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," of ",4);
          plVar13 = (long *)std::ostream::operator<<(poVar11,local_6e8);
          std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
          std::ostream::put((char)plVar13);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x199,local_7a8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
            operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
          std::ios_base::~ios_base(local_670);
          fclose(__stream);
          __stream = (FILE *)cmsys::SystemTools::Fopen(&local_7f0,"rb");
          curl_easy_setopt(local_7d0,CURLOPT_READDATA,__stream);
          if (pvStack_7c0 != local_7c8) {
            pvStack_7c0 = local_7c8;
          }
          if (pvStack_720 != local_728) {
            pvStack_720 = local_728;
          }
          this->HasErrors = false;
          curl_easy_perform(local_7d0);
          if (local_7c8 != pvStack_7c0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6e0,"CURL output: [",0xe);
            if (pvStack_7c0 != local_7c8) {
              std::ostream::write((char *)local_6e0,(long)local_7c8);
              std::ostream::flush();
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6e0,"]",1);
            cVar5 = (char)(ostringstream *)local_6e0;
            std::ios::widen((char)*(undefined8 *)((long)local_6e0 + -0x18) + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x1aa,local_7a8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet
                        );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
              operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
            std::ios_base::~ios_base(local_670);
            local_548.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_548.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_548.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar26 = (long)pvStack_7c0 - (long)local_7c8;
            if (uVar26 == 0) {
              pcVar18 = (pointer)0x0;
            }
            else {
              if ((long)uVar26 < 0) {
                std::__throw_bad_alloc();
              }
              pcVar18 = (pointer)operator_new(uVar26);
            }
            local_548.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = pcVar18 + uVar26;
            sVar23 = (long)pvStack_7c0 - (long)local_7c8;
            local_548.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = pcVar18;
            if (sVar23 != 0) {
              local_548.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish = pcVar18;
              memmove(pcVar18,local_7c8,sVar23);
            }
            local_548.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = pcVar18 + sVar23;
            ParseResponse(this,&local_548);
            if (pcVar18 != (pointer)0x0) {
              operator_delete(pcVar18,uVar26);
            }
          }
          curl_easy_getinfo(local_7d0,CURLINFO_RESPONSE_CODE,&local_6f0);
          if ((local_6f0 == 200) && (this->HasErrors != true)) {
            local_7f1 = 1;
            bVar8 = false;
          }
          else {
            bVar8 = true;
          }
        } while (bVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        bVar22 = local_7f1;
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
          bVar22 = local_7f1;
        }
      }
      fclose(__stream);
      if ((bVar22 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_6e0,"   Error when uploading file: ",0x1e);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_6e0,local_7f0._M_dataplus._M_p,
                             local_7f0._M_string_length);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1ba,(char *)local_830._0_8_,false);
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
        std::ios_base::~ios_base(local_670);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_6e0,"   Error message was: ",0x16);
        sVar23 = strlen(local_438);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6e0,local_438,sVar23);
        cVar5 = (char)(ostringstream *)local_6e0;
        std::ios::widen((char)*(undefined8 *)((long)local_6e0 + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1bc,(char *)local_830._0_8_,false);
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
        std::ios_base::~ios_base(local_670);
        poVar11 = this->LogFile;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"   Error when uploading file: ",0x1e);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_7f0._M_dataplus._M_p,local_7f0._M_string_length);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"   Error message was: ",0x16);
        sVar23 = strlen(local_438);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_438,sVar23);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        if (local_7c8 != pvStack_7c0) {
          poVar11 = this->LogFile;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"   Curl output was: ",0x14);
          if (pvStack_7c0 != local_7c8) {
            std::ostream::write((char *)poVar11,(long)local_7c8);
            std::ostream::flush();
          }
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_6e0,"CURL output: [",0xe);
          if (pvStack_7c0 != local_7c8) {
            std::ostream::write((char *)local_6e0,(long)local_7c8);
            std::ostream::flush();
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6e0,"]",1);
          std::ios::widen((char)*(undefined8 *)((long)local_6e0 + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1c9,(char *)local_830._0_8_,false);
          if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
            operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
          std::ios_base::~ios_base(local_670);
        }
        curl_easy_cleanup(in_stack_fffffffffffff7c8);
        curl_slist_free_all(local_768);
        curl_global_cleanup();
      }
      else {
        curl_easy_cleanup(in_stack_fffffffffffff7c8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_830,"   Uploaded: ",&local_7f0);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_6e0,(char *)local_830._0_8_,local_830._8_8_);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1d4,(char *)local_830._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,(ulong)(local_830._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e0);
        std::ios_base::~ios_base(local_670);
      }
      if (local_728 != (void *)0x0) {
        operator_delete(local_728,local_718 - (long)local_728);
      }
      if (local_7c8 != (void *)0x0) {
        operator_delete(local_7c8,local_7b8 - (long)local_7c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760._M_dataplus._M_p != &local_760.field_2) {
        operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_568._M_dataplus._M_p != &local_568.field_2) {
        operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_710._M_dataplus._M_p != &local_710.field_2) {
        operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
      }
      psVar19 = local_4b0;
      if ((bVar22 & 1) == 0) goto LAB_002b8a87;
    }
    psVar19 = psVar19 + 1;
    local_7f2 = psVar19 == local_4b8;
  } while( true );
}

Assistant:

bool cmCTestSubmitHandler::SubmitUsingHTTP(
  const std::string& localprefix, const std::vector<std::string>& files,
  const std::string& remoteprefix, const std::string& url)
{
  CURL* curl;
  FILE* ftpfile;
  char error_buffer[1024];
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");

  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }

  /* In windows, this will init the winsock stuff */
  ::curl_global_init(CURL_GLOBAL_ALL);
  cmCTestCurlOpts curlOpts(this->CTest);
  for (std::string const& file : files) {
    /* get a curl handle */
    curl = curl_easy_init();
    if (curl) {
      cmCurlSetCAInfo(curl);
      if (curlOpts.TLSVersionOpt) {
        cm::optional<std::string> tlsVersionStr =
          cmCurlPrintTLSVersion(*curlOpts.TLSVersionOpt);
        cmCTestOptionalLog(
          this->CTest, HANDLER_VERBOSE_OUTPUT,
          "  Set CURLOPT_SSLVERSION to "
            << (tlsVersionStr ? *tlsVersionStr : "unknown value") << "\n",
          this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSLVERSION, *curlOpts.TLSVersionOpt);
      }
      if (curlOpts.TLSVerifyOpt) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYPEER to "
                             << (*curlOpts.TLSVerifyOpt ? "on" : "off")
                             << "\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER,
                         *curlOpts.TLSVerifyOpt ? 1 : 0);
      }
      if (curlOpts.VerifyHostOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYHOST to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0);
      }

      // Using proxy
      if (this->HTTPProxyType > 0) {
        curl_easy_setopt(curl, CURLOPT_PROXY, this->HTTPProxy.c_str());
        switch (this->HTTPProxyType) {
          case 2:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS4);
            break;
          case 3:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS5);
            break;
          default:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
            if (!this->HTTPProxyAuth.empty()) {
              curl_easy_setopt(curl, CURLOPT_PROXYUSERPWD,
                               this->HTTPProxyAuth.c_str());
            }
        }
      }
      if (this->CTest->ShouldUseHTTP10()) {
        curl_easy_setopt(curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_0);
      }
      /* enable uploading */
      curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);

      // if there is little to no activity for too long stop submitting
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
      auto submitInactivityTimeout = this->GetSubmitInactivityTimeout();
      if (submitInactivityTimeout != 0) {
        ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME,
                           submitInactivityTimeout);
      }

      ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);

      ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

      std::string local_file = file;
      bool initialize_cdash_buildid = false;
      if (!cmSystemTools::FileExists(local_file)) {
        local_file = cmStrCat(localprefix, "/", file);
        // If this file exists within the local Testing directory we assume
        // that it will be associated with the current build in CDash.
        initialize_cdash_buildid = true;
      }
      std::string remote_file =
        remoteprefix + cmSystemTools::GetFilenameName(file);

      *this->LogFile << "\tUpload file: " << local_file << " to "
                     << remote_file << std::endl;

      std::string ofile = cmSystemTools::EncodeURL(remote_file);
      std::string upload_as =
        cmStrCat(url, ((url.find('?') == std::string::npos) ? '?' : '&'),
                 "FileName=", ofile);

      if (initialize_cdash_buildid) {
        // Provide extra arguments to CDash so that it can initialize and
        // return a buildid.
        cmCTestCurl ctest_curl(this->CTest);
        upload_as += "&build=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("BuildName"));
        upload_as += "&site=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("Site"));
        upload_as += "&stamp=";
        upload_as += ctest_curl.Escape(this->CTest->GetCurrentTag());
        upload_as += "-";
        upload_as += ctest_curl.Escape(this->CTest->GetTestModelString());
        cmCTestScriptHandler* ch = this->CTest->GetScriptHandler();
        cmake* cm = ch->GetCMake();
        if (cm) {
          cmValue subproject = cm->GetState()->GetGlobalProperty("SubProject");
          if (subproject) {
            upload_as += "&subproject=";
            upload_as += ctest_curl.Escape(*subproject);
          }
        }
      }

      // Generate Done.xml right before it is submitted.
      // The reason for this is two-fold:
      // 1) It must be generated after some other part has been submitted
      //    so we have a buildId to refer to in its contents.
      // 2) By generating Done.xml here its timestamp will be as late as
      //    possible. This gives us a more accurate record of how long the
      //    entire build took to complete.
      if (file == "Done.xml") {
        this->CTest->GenerateDoneFile();
      }

      upload_as += "&MD5=";

      if (this->GetOption("InternalTest").IsOn()) {
        upload_as += "ffffffffffffffffffffffffffffffff";
      } else {
        cmCryptoHash hasher(cmCryptoHash::AlgoMD5);
        upload_as += hasher.HashFile(local_file);
      }

      if (!cmSystemTools::FileExists(local_file)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Cannot find file: " << local_file << std::endl);
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      unsigned long filelen = cmSystemTools::FileLength(local_file);

      ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "   Upload file: " << local_file << " to "
                                            << upload_as << " Size: "
                                            << filelen << std::endl,
                         this->Quiet);

      // specify target
      ::curl_easy_setopt(curl, CURLOPT_URL, upload_as.c_str());

      // follow redirects
      ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1);

      // CURLAUTH_BASIC is default, and here we allow additional methods,
      // including more secure ones
      ::curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_ANY);

      // now specify which file to upload
      ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

      // and give the size of the upload (optional)
      ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(filelen));

      // and give curl the buffer for errors
      ::curl_easy_setopt(curl, CURLOPT_ERRORBUFFER, &error_buffer);

      // specify handler for output
      ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                         cmCTestSubmitHandlerWriteMemoryCallback);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                         cmCTestSubmitHandlerCurlDebugCallback);

      /* we pass our 'chunk' struct to the callback function */
      cmCTestSubmitHandlerVectorOfChar chunk;
      cmCTestSubmitHandlerVectorOfChar chunkDebug;
      ::curl_easy_setopt(curl, CURLOPT_FILE, &chunk);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);

      // Now run off and do what you've been told!
      ::curl_easy_perform(curl);

      if (!chunk.empty()) {
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "CURL output: ["
                             << cmCTestLogWrite(chunk.data(), chunk.size())
                             << "]" << std::endl,
                           this->Quiet);
        this->ParseResponse(chunk);
      }
      if (!chunkDebug.empty()) {
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "CURL debug output: ["
            << cmCTestLogWrite(chunkDebug.data(), chunkDebug.size()) << "]"
            << std::endl,
          this->Quiet);
      }

      // If curl failed for any reason, or checksum fails, wait and retry
      //
      long response_code;
      curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response_code);
      bool successful_submission = response_code == 200;

      if (!successful_submission || this->HasErrors) {
        std::string retryDelay = *this->GetOption("RetryDelay");
        std::string retryCount = *this->GetOption("RetryCount");

        auto delay = cmDuration(
          retryDelay.empty()
            ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryDelay")
                     .c_str())
            : atoi(retryDelay.c_str()));
        int count = retryCount.empty()
          ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryCount")
                   .c_str())
          : atoi(retryCount.c_str());

        for (int i = 0; i < count; i++) {
          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Submit failed, waiting " << delay.count()
                                                          << " seconds...\n",
                             this->Quiet);

          auto stop = std::chrono::steady_clock::now() + delay;
          while (std::chrono::steady_clock::now() < stop) {
            cmSystemTools::Delay(100);
          }

          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Retry submission: Attempt "
                               << (i + 1) << " of " << count << std::endl,
                             this->Quiet);

          ::fclose(ftpfile);
          ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
          ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

          chunk.clear();
          chunkDebug.clear();
          this->HasErrors = false;

          ::curl_easy_perform(curl);

          if (!chunk.empty()) {
            cmCTestOptionalLog(this->CTest, DEBUG,
                               "CURL output: ["
                                 << cmCTestLogWrite(chunk.data(), chunk.size())
                                 << "]" << std::endl,
                               this->Quiet);
            this->ParseResponse(chunk);
          }

          curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response_code);
          if (response_code == 200 && !this->HasErrors) {
            successful_submission = true;
            break;
          }
        }
      }

      fclose(ftpfile);
      if (!successful_submission) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error when uploading file: " << local_file
                                                    << std::endl);
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error message was: " << error_buffer << std::endl);
        *this->LogFile << "   Error when uploading file: " << local_file
                       << std::endl
                       << "   Error message was: " << error_buffer
                       << std::endl;
        // avoid deref of begin for zero size array
        if (!chunk.empty()) {
          *this->LogFile << "   Curl output was: "
                         << cmCTestLogWrite(chunk.data(), chunk.size())
                         << std::endl;
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "CURL output: ["
                       << cmCTestLogWrite(chunk.data(), chunk.size()) << "]"
                       << std::endl);
        }
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      // always cleanup
      ::curl_easy_cleanup(curl);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Uploaded: " + local_file << std::endl,
                         this->Quiet);
    }
  }
  ::curl_slist_free_all(headers);
  ::curl_global_cleanup();
  return true;
}